

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

long BIO_callback_ctrl(BIO *b,int cmd,fp *fp)

{
  _func_602 *UNRECOVERED_JUMPTABLE;
  long lVar1;
  
  if (b != (BIO *)0x0) {
    if ((b->method != (BIO_METHOD *)0x0) &&
       (UNRECOVERED_JUMPTABLE = b->method->callback_ctrl, UNRECOVERED_JUMPTABLE != (_func_602 *)0x0)
       ) {
      lVar1 = (*UNRECOVERED_JUMPTABLE)(b,cmd,fp);
      return lVar1;
    }
    ERR_put_error(0x11,0,0x73,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/bio.cc"
                  ,0xfd);
  }
  return 0;
}

Assistant:

long BIO_callback_ctrl(BIO *bio, int cmd, BIO_info_cb *fp) {
  if (bio == NULL) {
    return 0;
  }

  if (bio->method == NULL || bio->method->callback_ctrl == NULL) {
    OPENSSL_PUT_ERROR(BIO, BIO_R_UNSUPPORTED_METHOD);
    return 0;
  }

  return bio->method->callback_ctrl(bio, cmd, fp);
}